

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClientConductor.cpp
# Opt level: O1

void __thiscall
aeron::ClientConductor::onAvailableCounter
          (ClientConductor *this,int64_t registrationId,int32_t counterId)

{
  _Atomic_word *p_Var1;
  pointer pCVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar3;
  __weak_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  int iVar5;
  pointer pCVar6;
  long lVar7;
  pointer pCVar8;
  undefined1 local_4d;
  int32_t local_4c;
  __weak_ptr<aeron::Counter,_(__gnu_cxx::_Lock_policy)2> local_48;
  ClientConductor *local_30;
  
  local_4c = counterId;
  iVar5 = pthread_mutex_lock((pthread_mutex_t *)&this->m_adminLock);
  if (iVar5 != 0) {
    std::__throw_system_error(iVar5);
  }
  pCVar8 = (this->m_counters).
           super__Vector_base<aeron::ClientConductor::CounterStateDefn,_std::allocator<aeron::ClientConductor::CounterStateDefn>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pCVar2 = (this->m_counters).
           super__Vector_base<aeron::ClientConductor::CounterStateDefn,_std::allocator<aeron::ClientConductor::CounterStateDefn>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar7 = ((long)pCVar2 - (long)pCVar8 >> 5) * -0x5555555555555555 >> 2;
  pCVar6 = pCVar8;
  if (0 < lVar7) {
    pCVar6 = pCVar8 + lVar7 * 4;
    lVar7 = lVar7 + 1;
    pCVar8 = pCVar8 + 2;
    do {
      if (pCVar8[-2].m_registrationId == registrationId) {
        pCVar8 = pCVar8 + -2;
        goto LAB_00142492;
      }
      if (pCVar8[-1].m_registrationId == registrationId) {
        pCVar8 = pCVar8 + -1;
        goto LAB_00142492;
      }
      if (pCVar8->m_registrationId == registrationId) goto LAB_00142492;
      if (pCVar8[1].m_registrationId == registrationId) {
        pCVar8 = pCVar8 + 1;
        goto LAB_00142492;
      }
      lVar7 = lVar7 + -1;
      pCVar8 = pCVar8 + 4;
    } while (1 < lVar7);
  }
  lVar7 = ((long)pCVar2 - (long)pCVar6 >> 5) * -0x5555555555555555;
  if (lVar7 != 1) {
    if (lVar7 != 2) {
      pCVar8 = pCVar2;
      if ((lVar7 != 3) || (pCVar8 = pCVar6, pCVar6->m_registrationId == registrationId))
      goto LAB_00142492;
      pCVar6 = pCVar6 + 1;
    }
    pCVar8 = pCVar6;
    if (pCVar6->m_registrationId == registrationId) goto LAB_00142492;
    pCVar6 = pCVar6 + 1;
  }
  pCVar8 = pCVar6;
  if (pCVar6->m_registrationId != registrationId) {
    pCVar8 = pCVar2;
  }
LAB_00142492:
  if ((pCVar8 != pCVar2) && (pCVar8->m_status == AWAITING_MEDIA_DRIVER)) {
    pCVar8->m_status = REGISTERED_MEDIA_DRIVER;
    pCVar8->m_counterId = local_4c;
    local_48._M_ptr = (element_type *)0x0;
    local_30 = this;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<aeron::Counter,std::allocator<aeron::Counter>,aeron::ClientConductor*,aeron::concurrent::AtomicBuffer&,long&,int&>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_48._M_refcount,&local_48._M_ptr,
               (allocator<aeron::Counter> *)&local_4d,&local_30,this->m_counterValuesBuffer,
               &pCVar8->m_registrationId,&local_4c);
    _Var4._M_pi = local_48._M_refcount._M_pi;
    peVar3 = local_48._M_ptr;
    local_48._M_ptr = (element_type *)0x0;
    local_48._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    this_00 = (pCVar8->m_counterCache).
              super___shared_ptr<aeron::Counter,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    (pCVar8->m_counterCache).super___shared_ptr<aeron::Counter,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         peVar3;
    (pCVar8->m_counterCache).super___shared_ptr<aeron::Counter,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = _Var4._M_pi;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    if (local_48._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48._M_refcount._M_pi);
    }
    local_48._M_ptr =
         (pCVar8->m_counterCache).super___shared_ptr<aeron::Counter,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr;
    local_48._M_refcount._M_pi =
         (pCVar8->m_counterCache).super___shared_ptr<aeron::Counter,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
    if (local_48._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_48._M_refcount._M_pi)->_M_weak_count =
             (local_48._M_refcount._M_pi)->_M_weak_count + 1;
        UNLOCK();
      }
      else {
        (local_48._M_refcount._M_pi)->_M_weak_count =
             (local_48._M_refcount._M_pi)->_M_weak_count + 1;
      }
    }
    std::__weak_ptr<aeron::Counter,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&(pCVar8->m_counter).super___weak_ptr<aeron::Counter,_(__gnu_cxx::_Lock_policy)2>,
               &local_48);
    if (local_48._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var1 = &(local_48._M_refcount._M_pi)->_M_weak_count;
        iVar5 = *p_Var1;
        *p_Var1 = *p_Var1 + -1;
        UNLOCK();
      }
      else {
        iVar5 = (local_48._M_refcount._M_pi)->_M_weak_count;
        (local_48._M_refcount._M_pi)->_M_weak_count = iVar5 + -1;
      }
      if (iVar5 == 1) {
        (*(local_48._M_refcount._M_pi)->_vptr__Sp_counted_base[3])();
      }
    }
  }
  local_30 = (ClientConductor *)CONCAT44(local_30._4_4_,local_4c);
  local_48._M_ptr = (element_type *)registrationId;
  if ((this->m_onAvailableCounterHandler).super__Function_base._M_manager == (_Manager_type)0x0) {
    std::__throw_bad_function_call();
  }
  (*(this->m_onAvailableCounterHandler)._M_invoker)
            ((_Any_data *)&this->m_onAvailableCounterHandler,&this->m_countersReader,
             (long *)&local_48,(int *)&local_30);
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_adminLock);
  return;
}

Assistant:

void ClientConductor::onAvailableCounter(
    std::int64_t registrationId,
    std::int32_t counterId)
{
    std::lock_guard<std::recursive_mutex> lock(m_adminLock);

    auto counterIt = std::find_if(m_counters.begin(), m_counters.end(),
        [registrationId](const CounterStateDefn &entry)
        {
            return registrationId == entry.m_registrationId;
        });

    if (counterIt != m_counters.end() && (*counterIt).m_status == RegistrationStatus::AWAITING_MEDIA_DRIVER)
    {
        CounterStateDefn& state = (*counterIt);

        state.m_status = RegistrationStatus::REGISTERED_MEDIA_DRIVER;
        state.m_counterId = counterId;
        state.m_counterCache = std::make_shared<Counter>(this, m_counterValuesBuffer, state.m_registrationId, counterId);
        state.m_counter = std::weak_ptr<Counter>(state.m_counterCache);
    }

    m_onAvailableCounterHandler(m_countersReader, registrationId, counterId);
}